

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

CharPtr __thiscall fmt::BasicWriter<wchar_t>::grow_buffer(BasicWriter<wchar_t> *this,size_t n)

{
  size_t index;
  wchar_t *pwVar1;
  size_t in_RSI;
  Buffer<wchar_t> *in_RDI;
  size_t size;
  size_t in_stack_ffffffffffffffd8;
  
  index = Buffer<wchar_t>::size(*(Buffer<wchar_t> **)(in_RDI + 8));
  Buffer<wchar_t>::resize(in_RDI,in_stack_ffffffffffffffd8);
  pwVar1 = Buffer<wchar_t>::operator[](*(Buffer<wchar_t> **)(in_RDI + 8),index);
  pwVar1 = internal::make_ptr<wchar_t>(pwVar1,in_RSI);
  return pwVar1;
}

Assistant:

CharPtr grow_buffer(std::size_t n) {
    std::size_t size = buffer_.size();
    buffer_.resize(size + n);
    return internal::make_ptr(&buffer_[size], n);
  }